

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O1

void cfd::capi::CheckEmptyString(char *parameter,char *name,CfdSourceLocation *location)

{
  CfdException *this;
  long *plVar1;
  size_type *psVar2;
  bool bVar3;
  allocator local_89;
  char *local_88;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (parameter == (char *)0x0) {
    bVar3 = true;
  }
  else {
    bVar3 = *parameter == '\0';
  }
  if ((name != (char *)0x0) && (bVar3)) {
    local_88 = name;
    core::logger::log<char_const*&>(location,kCfdLogLevelWarning,"{} is null or empty.",&local_88);
    this = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_60,local_88,&local_89);
    std::operator+(&local_40,"Failed to parameter. ",&local_60);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_40);
    local_80._M_dataplus._M_p = (pointer)*plVar1;
    psVar2 = (size_type *)(plVar1 + 2);
    if ((size_type *)local_80._M_dataplus._M_p == psVar2) {
      local_80.field_2._M_allocated_capacity = *psVar2;
      local_80.field_2._8_8_ = plVar1[3];
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    }
    else {
      local_80.field_2._M_allocated_capacity = *psVar2;
    }
    local_80._M_string_length = plVar1[1];
    *plVar1 = (long)psVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    core::CfdException::CfdException(this,kCfdIllegalArgumentError,&local_80);
    __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  return;
}

Assistant:

void CheckEmptyString(
    const char* parameter, const char* name,
    const cfd::core::logger::CfdSourceLocation& location) {
  if (IsEmptyString(parameter) && (name != nullptr)) {
    warn(location, "{} is null or empty.", name);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to parameter. " + std::string(name) + " is null or empty.");
  }
}